

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2D::IfcCartesianTransformationOperator2D
          (IfcCartesianTransformationOperator2D *this)

{
  IfcCartesianTransformationOperator2D *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcCartesianTransformationOperator).field_0x78,
             "IfcCartesianTransformationOperator2D");
  IfcCartesianTransformationOperator::IfcCartesianTransformationOperator
            (&this->super_IfcCartesianTransformationOperator,&PTR_construction_vtable_24__00f85df8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2D,_0UL>::
  ObjectHelper((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2D,_0UL> *)
               &(this->super_IfcCartesianTransformationOperator).field_0x68,
               &PTR_construction_vtable_24__00f85e70);
  (this->super_IfcCartesianTransformationOperator).super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf85d40;
  *(undefined8 *)&(this->super_IfcCartesianTransformationOperator).field_0x78 = 0xf85de0;
  *(undefined8 *)
   &(this->super_IfcCartesianTransformationOperator).super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf85d68;
  *(undefined8 *)
   &(this->super_IfcCartesianTransformationOperator).super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf85d90;
  *(undefined8 *)&(this->super_IfcCartesianTransformationOperator).field_0x68 = 0xf85db8;
  return;
}

Assistant:

IfcCartesianTransformationOperator2D() : Object("IfcCartesianTransformationOperator2D") {}